

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O1

bson_t * get_bson(char *filename)

{
  int __fd;
  ulong uVar1;
  bson_t *pbVar2;
  bson_t *extraout_RAX;
  uint8_t buf [4096];
  undefined1 auStack_1018 [4104];
  
  __fd = open(filename,0);
  if (__fd != -1) {
    uVar1 = read(__fd,auStack_1018,0x1000);
    if ((long)uVar1 < 0) goto LAB_0012bec0;
    if (uVar1 != 0) {
      pbVar2 = (bson_t *)bson_new_from_data(auStack_1018,uVar1 & 0xffffffff);
      close(__fd);
      return pbVar2;
    }
    get_bson_cold_1();
  }
  get_bson_cold_3();
LAB_0012bec0:
  get_bson_cold_2();
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/x1000",test_bson_as_json_x1000);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/multi",test_bson_as_json_multi);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/string",test_bson_as_json_string);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/int32",test_bson_as_json_int32);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/int64",test_bson_as_json_int64);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/double",test_bson_as_json_double);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/double/nonfinite",
                test_bson_as_json_double_nonfinite);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/code",test_bson_as_json_code);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/date_time",test_bson_as_json_date_time);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/regex",test_bson_as_json_regex);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/symbol",test_bson_as_json_symbol);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/utf8",test_bson_as_json_utf8);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
  TestSuite_Add((TestSuite *)filename,"/bson/as_canonical_extended_json/dbpointer",
                test_bson_as_canonical_extended_json_dbpointer);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/stack_overflow",
                test_bson_as_json_stack_overflow);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/corrupt",test_bson_corrupt);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json_spacing",test_bson_as_json_spacing);
  TestSuite_Add((TestSuite *)filename,"/bson/array_as_json",test_bson_array_as_json);
  TestSuite_Add((TestSuite *)filename,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/buffering",test_bson_json_read_buffering);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read",test_bson_json_read);
  TestSuite_Add((TestSuite *)filename,"/bson/json/inc",test_bson_json_inc);
  TestSuite_Add((TestSuite *)filename,"/bson/json/array",test_bson_json_array);
  TestSuite_Add((TestSuite *)filename,"/bson/json/array/single",test_bson_json_array_single);
  TestSuite_Add((TestSuite *)filename,"/bson/json/array/int64",test_bson_json_array_int64);
  TestSuite_Add((TestSuite *)filename,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
  TestSuite_Add((TestSuite *)filename,"/bson/json/date",test_bson_json_date);
  TestSuite_Add((TestSuite *)filename,"/bson/json/date/legacy",test_bson_json_date_legacy);
  TestSuite_Add((TestSuite *)filename,"/bson/json/date/long",test_bson_json_date_numberlong);
  TestSuite_Add((TestSuite *)filename,"/bson/json/timestamp",test_bson_json_timestamp);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/empty",test_bson_json_read_empty);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/missing_complex",
                test_bson_json_read_missing_complex);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/invalid_binary",
                test_bson_json_read_invalid_binary);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/invalid_json",
                test_bson_json_read_invalid_json);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/invalid",test_bson_json_read_invalid);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/corrupt_utf8",
                test_bson_json_read_corrupt_utf8);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/legacy_regex",
                test_bson_json_read_legacy_regex);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/regex_options_order",
                test_bson_json_read_regex_options_order);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/binary",test_bson_json_read_binary);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/legacy_binary",
                test_bson_json_read_legacy_binary);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/file",test_json_reader_new_from_file);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path)
  ;
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/$numberLong",test_bson_json_number_long);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/$numberLong/zero",
                test_bson_json_number_long_zero);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/code",test_bson_json_code);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/code/errors",test_bson_json_code_errors);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/dbref",test_bson_json_dbref);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/uescape",test_bson_json_uescape);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/int32",test_bson_json_int32);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/int64",test_bson_json_int64);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/double",test_bson_json_double);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/double/overflow",
                test_bson_json_double_overflow);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/double/nan",test_bson_json_nan);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/double/infinity",test_bson_json_infinity);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/null",test_bson_json_null);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/empty_final",
                test_bson_json_empty_final_object);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal
               );
  TestSuite_Add((TestSuite *)filename,"/bson/json/errors",test_bson_json_errors);
  TestSuite_Add((TestSuite *)filename,"/bson/integer/width",test_bson_integer_width);
  TestSuite_Add((TestSuite *)filename,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
  TestSuite_Add((TestSuite *)filename,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
  return extraout_RAX;
}

Assistant:

static bson_t *
get_bson (const char *filename)
{
   uint8_t buf[4096];
   bson_t *b;
   ssize_t len;
   int fd;

   if (-1 == (fd = bson_open (filename, O_RDONLY))) {
      fprintf (stderr, "Failed to open: %s\n", filename);
      abort ();
   }
   if ((len = bson_read (fd, buf, sizeof buf)) < 0) {
      fprintf (stderr, "Failed to read: %s\n", filename);
      abort ();
   }
   BSON_ASSERT (len > 0);
   b = bson_new_from_data (buf, (uint32_t) len);
   bson_close (fd);

   return b;
}